

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O1

EdwardsPoint * ecc_edwards_point_copy(EdwardsPoint *orig)

{
  EdwardsCurve *pEVar1;
  EdwardsPoint *pEVar2;
  mp_int *pmVar3;
  
  pEVar1 = orig->ec;
  pEVar2 = (EdwardsPoint *)safemalloc(1,0x28,0);
  pEVar2->ec = pEVar1;
  pEVar2->X = (mp_int *)0x0;
  pEVar2->Y = (mp_int *)0x0;
  pEVar2->Z = (mp_int *)0x0;
  pEVar2->T = (mp_int *)0x0;
  pmVar3 = mp_copy(orig->X);
  pEVar2->X = pmVar3;
  pmVar3 = mp_copy(orig->Y);
  pEVar2->Y = pmVar3;
  pmVar3 = mp_copy(orig->Z);
  pEVar2->Z = pmVar3;
  pmVar3 = mp_copy(orig->T);
  pEVar2->T = pmVar3;
  return pEVar2;
}

Assistant:

EdwardsPoint *ecc_edwards_point_copy(EdwardsPoint *orig)
{
    EdwardsPoint *ep = ecc_edwards_point_new_empty(orig->ec);
    ep->X = mp_copy(orig->X);
    ep->Y = mp_copy(orig->Y);
    ep->Z = mp_copy(orig->Z);
    ep->T = mp_copy(orig->T);
    return ep;
}